

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O0

void __thiscall Pl_LZWDecoder::addToTable(Pl_LZWDecoder *this,uchar c)

{
  ulong uVar1;
  size_type sVar2;
  runtime_error *prVar3;
  uchar *__dest;
  uchar *new_data;
  Buffer entry;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_t local_48;
  Buffer *local_40;
  Buffer *b;
  uint local_28;
  uchar local_21;
  uint idx;
  uchar tmp [1];
  uchar *last_data;
  uint last_size;
  uchar c_local;
  Pl_LZWDecoder *this_local;
  
  _idx = (uchar *)0x0;
  if (this->last_code < 0x100) {
    local_21 = (uchar)this->last_code;
    _idx = &local_21;
    last_data._0_4_ = 1;
  }
  else {
    if (this->last_code < 0x102) {
      entry.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>.
      _M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl._7_1_ = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_a8,this->last_code);
      std::operator+(&local_88,"Pl_LZWDecoder::addToTable called with invalid code (",&local_a8);
      std::operator+(&local_68,&local_88,")");
      std::runtime_error::runtime_error(prVar3,(string *)&local_68);
      entry.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>.
      _M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl._7_1_ = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_28 = this->last_code - 0x102;
    uVar1 = (ulong)local_28;
    sVar2 = std::vector<Buffer,_std::allocator<Buffer>_>::size(&this->table);
    if (sVar2 <= uVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Pl_LZWDecoder::addToTable: table overflow");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_40 = std::vector<Buffer,_std::allocator<Buffer>_>::at(&this->table,(ulong)local_28);
    _idx = Buffer::getBuffer(local_40);
    local_48 = Buffer::getSize(local_40);
    last_data._0_4_ = QIntC::to_uint<unsigned_long>(&local_48);
  }
  Buffer::Buffer((Buffer *)&new_data,(ulong)((uint)last_data + 1));
  __dest = Buffer::getBuffer((Buffer *)&new_data);
  memcpy(__dest,_idx,(ulong)(uint)last_data);
  __dest[(uint)last_data] = c;
  std::vector<Buffer,_std::allocator<Buffer>_>::push_back(&this->table,(value_type *)&new_data);
  Buffer::~Buffer((Buffer *)&new_data);
  return;
}

Assistant:

void
Pl_LZWDecoder::addToTable(unsigned char c)
{
    unsigned int last_size = 0;
    unsigned char const* last_data = nullptr;
    unsigned char tmp[1];

    if (this->last_code < 256) {
        tmp[0] = static_cast<unsigned char>(this->last_code);
        last_data = tmp;
        last_size = 1;
    } else if (this->last_code > 257) {
        unsigned int idx = this->last_code - 258;
        if (idx >= table.size()) {
            throw std::runtime_error("Pl_LZWDecoder::addToTable: table overflow");
        }
        Buffer& b = table.at(idx);
        last_data = b.getBuffer();
        last_size = QIntC::to_uint(b.getSize());
    } else {
        throw std::runtime_error(
            "Pl_LZWDecoder::addToTable called with invalid code (" +
            std::to_string(this->last_code) + ")");
    }

    Buffer entry(1 + last_size);
    unsigned char* new_data = entry.getBuffer();
    memcpy(new_data, last_data, last_size);
    new_data[last_size] = c;
    this->table.push_back(std::move(entry));
}